

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Result.cpp
# Opt level: O0

Result * CoreML::Result::featureTypeInvariantError
                   (Result *__return_storage_ptr__,
                   vector<CoreML::FeatureType,_std::allocator<CoreML::FeatureType>_> *allowed,
                   FeatureType *actual)

{
  ulong uVar1;
  ostream *poVar2;
  size_type sVar3;
  const_reference this;
  string local_228 [32];
  string local_208;
  ulong local_1e8;
  size_t i;
  stringstream local_1b0 [8];
  stringstream ss;
  ostream local_1a0 [383];
  byte local_21;
  FeatureType *local_20;
  FeatureType *actual_local;
  vector<CoreML::FeatureType,_std::allocator<CoreML::FeatureType>_> *allowed_local;
  Result *out;
  
  local_21 = 0;
  local_20 = actual;
  actual_local = (FeatureType *)allowed;
  allowed_local =
       (vector<CoreML::FeatureType,_std::allocator<CoreML::FeatureType>_> *)__return_storage_ptr__;
  Result(__return_storage_ptr__);
  std::__cxx11::stringstream::stringstream(local_1b0);
  std::operator<<(local_1a0,"Feature type invariant violation. Expected feature type ");
  FeatureType::toString_abi_cxx11_((string *)&i,local_20);
  poVar2 = std::operator<<(local_1a0,(string *)&i);
  std::operator<<(poVar2," to be one of: ");
  std::__cxx11::string::~string((string *)&i);
  local_1e8 = 0;
  while( true ) {
    uVar1 = local_1e8;
    sVar3 = std::vector<CoreML::FeatureType,_std::allocator<CoreML::FeatureType>_>::size
                      ((vector<CoreML::FeatureType,_std::allocator<CoreML::FeatureType>_> *)
                       actual_local);
    if (sVar3 <= uVar1) break;
    this = std::vector<CoreML::FeatureType,_std::allocator<CoreML::FeatureType>_>::operator[]
                     ((vector<CoreML::FeatureType,_std::allocator<CoreML::FeatureType>_> *)
                      actual_local,local_1e8);
    FeatureType::toString_abi_cxx11_(&local_208,this);
    std::operator<<(local_1a0,(string *)&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    uVar1 = local_1e8;
    sVar3 = std::vector<CoreML::FeatureType,_std::allocator<CoreML::FeatureType>_>::size
                      ((vector<CoreML::FeatureType,_std::allocator<CoreML::FeatureType>_> *)
                       actual_local);
    if (uVar1 != sVar3 - 1) {
      std::operator<<(local_1a0,", ");
    }
    local_1e8 = local_1e8 + 1;
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->m_message,local_228);
  std::__cxx11::string::~string(local_228);
  __return_storage_ptr__->m_type = FEATURE_TYPE_INVARIANT_VIOLATION;
  local_21 = 1;
  std::__cxx11::stringstream::~stringstream(local_1b0);
  if ((local_21 & 1) == 0) {
    ~Result(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Result Result::featureTypeInvariantError(
      const std::vector<FeatureType>& allowed,
      const FeatureType& actual) {

    Result out;
    std::stringstream ss;
    ss << "Feature type invariant violation. Expected feature type ";
    ss << actual.toString() << " to be one of: ";
    for (size_t i=0; i<allowed.size(); i++) {
      ss << allowed[i].toString();
      if (i != allowed.size() - 1) {
        ss << ", ";
      }
    }
    out.m_message = ss.str();
    out.m_type = ResultType::FEATURE_TYPE_INVARIANT_VIOLATION;
    return out;
  }